

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

ParameterizedTestSuiteInfo<MyTest> *
testing::internal::
CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<MyTest>,testing::internal::ParameterizedTestSuiteInfoBase>
          (ParameterizedTestSuiteInfoBase *base)

{
  long lVar1;
  bool bVar2;
  GTestLog local_c;
  
  if (base == (ParameterizedTestSuiteInfoBase *)0x0) {
    bVar2 = true;
  }
  else {
    lVar1 = __dynamic_cast(base,&ParameterizedTestSuiteInfoBase::typeinfo,
                           &ParameterizedTestSuiteInfo<MyTest>::typeinfo,0);
    bVar2 = lVar1 != 0;
  }
  bVar2 = IsTrue(bVar2);
  if (!bVar2) {
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/build_O2/test/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x486);
    std::operator<<((ostream *)&std::cerr,
                    "Condition base == nullptr || dynamic_cast<Derived*>(base) != nullptr failed. ")
    ;
    GTestLog::~GTestLog(&local_c);
  }
  return (ParameterizedTestSuiteInfo<MyTest> *)base;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
  static_assert(std::is_base_of<Base, Derived>::value,
                "target type not derived from source type");
#if GTEST_HAS_RTTI
  GTEST_CHECK_(base == nullptr || dynamic_cast<Derived*>(base) != nullptr);
#endif
  return static_cast<Derived*>(base);
}